

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::MemberSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  switch(kind) {
  case AlwaysBlock:
  case AlwaysCombBlock:
  case AlwaysFFBlock:
  case AlwaysLatchBlock:
  case AnonymousProgram:
  case BindDirective:
  case BinsSelection:
  case CaseGenerate:
  case CheckerDataDeclaration:
  case CheckerDeclaration:
  case CheckerInstantiation:
  case ClassDeclaration:
  case ClassMethodDeclaration:
  case ClassMethodPrototype:
  case ClassPropertyDeclaration:
  case ClockingDeclaration:
  case ClockingItem:
  case ConcurrentAssertionMember:
  case ConditionalPathDeclaration:
  case ConfigDeclaration:
  case ConstraintDeclaration:
  case ConstraintPrototype:
  case ContinuousAssign:
  case CoverCross:
  case CoverageBins:
  case CoverageOption:
  case CovergroupDeclaration:
  case Coverpoint:
  case DPIExport:
  case DPIImport:
  case DataDeclaration:
  case DefParam:
  case DefaultClockingReference:
  case DefaultDisableDeclaration:
  case DefaultSkewItem:
  case ElabSystemTask:
  case EmptyMember:
  case ExplicitAnsiPort:
  case ExternInterfaceMethod:
  case ExternModuleDecl:
  case ExternUdpDecl:
  case FinalBlock:
  case ForwardTypedefDeclaration:
  case FunctionDeclaration:
  case GenerateBlock:
  case GenerateRegion:
  case GenvarDeclaration:
  case HierarchyInstantiation:
  case IfGenerate:
  case IfNonePathDeclaration:
  case ImmediateAssertionMember:
  case ImplicitAnsiPort:
  case InitialBlock:
  case InterfaceDeclaration:
  case LetDeclaration:
  case LibraryDeclaration:
  case LibraryIncludeStatement:
  case LocalVariableDeclaration:
  case LoopGenerate:
  case ModportClockingPort:
  case ModportDeclaration:
  case ModportSimplePortList:
  case ModportSubroutinePortList:
  case ModuleDeclaration:
  case NetAlias:
  case NetDeclaration:
  case NetTypeDeclaration:
  case PackageDeclaration:
  case PackageExportAllDeclaration:
  case PackageExportDeclaration:
  case PackageImportDeclaration:
  case ParameterDeclarationStatement:
  case PathDeclaration:
  case PortDeclaration:
  case PrimitiveInstantiation:
  case ProgramDeclaration:
  case PropertyDeclaration:
  case PulseStyleDeclaration:
  case SequenceDeclaration:
  case SpecifyBlock:
  case SpecparamDeclaration:
  case SystemTimingCheck:
  case TaskDeclaration:
  case TimeUnitsDeclaration:
  case TypedefDeclaration:
  case UdpDeclaration:
  case UserDefinedNetDeclaration:
    local_1 = true;
    break;
  default:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool MemberSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::AlwaysBlock:
        case SyntaxKind::AlwaysCombBlock:
        case SyntaxKind::AlwaysFFBlock:
        case SyntaxKind::AlwaysLatchBlock:
        case SyntaxKind::AnonymousProgram:
        case SyntaxKind::BindDirective:
        case SyntaxKind::BinsSelection:
        case SyntaxKind::CaseGenerate:
        case SyntaxKind::CheckerDataDeclaration:
        case SyntaxKind::CheckerDeclaration:
        case SyntaxKind::CheckerInstantiation:
        case SyntaxKind::ClassDeclaration:
        case SyntaxKind::ClassMethodDeclaration:
        case SyntaxKind::ClassMethodPrototype:
        case SyntaxKind::ClassPropertyDeclaration:
        case SyntaxKind::ClockingDeclaration:
        case SyntaxKind::ClockingItem:
        case SyntaxKind::ConcurrentAssertionMember:
        case SyntaxKind::ConditionalPathDeclaration:
        case SyntaxKind::ConfigDeclaration:
        case SyntaxKind::ConstraintDeclaration:
        case SyntaxKind::ConstraintPrototype:
        case SyntaxKind::ContinuousAssign:
        case SyntaxKind::CoverCross:
        case SyntaxKind::CoverageBins:
        case SyntaxKind::CoverageOption:
        case SyntaxKind::CovergroupDeclaration:
        case SyntaxKind::Coverpoint:
        case SyntaxKind::DPIExport:
        case SyntaxKind::DPIImport:
        case SyntaxKind::DataDeclaration:
        case SyntaxKind::DefParam:
        case SyntaxKind::DefaultClockingReference:
        case SyntaxKind::DefaultDisableDeclaration:
        case SyntaxKind::DefaultSkewItem:
        case SyntaxKind::ElabSystemTask:
        case SyntaxKind::EmptyMember:
        case SyntaxKind::ExplicitAnsiPort:
        case SyntaxKind::ExternInterfaceMethod:
        case SyntaxKind::ExternModuleDecl:
        case SyntaxKind::ExternUdpDecl:
        case SyntaxKind::FinalBlock:
        case SyntaxKind::ForwardTypedefDeclaration:
        case SyntaxKind::FunctionDeclaration:
        case SyntaxKind::GenerateBlock:
        case SyntaxKind::GenerateRegion:
        case SyntaxKind::GenvarDeclaration:
        case SyntaxKind::HierarchyInstantiation:
        case SyntaxKind::IfGenerate:
        case SyntaxKind::IfNonePathDeclaration:
        case SyntaxKind::ImmediateAssertionMember:
        case SyntaxKind::ImplicitAnsiPort:
        case SyntaxKind::InitialBlock:
        case SyntaxKind::InterfaceDeclaration:
        case SyntaxKind::LetDeclaration:
        case SyntaxKind::LibraryDeclaration:
        case SyntaxKind::LibraryIncludeStatement:
        case SyntaxKind::LocalVariableDeclaration:
        case SyntaxKind::LoopGenerate:
        case SyntaxKind::ModportClockingPort:
        case SyntaxKind::ModportDeclaration:
        case SyntaxKind::ModportSimplePortList:
        case SyntaxKind::ModportSubroutinePortList:
        case SyntaxKind::ModuleDeclaration:
        case SyntaxKind::NetAlias:
        case SyntaxKind::NetDeclaration:
        case SyntaxKind::NetTypeDeclaration:
        case SyntaxKind::PackageDeclaration:
        case SyntaxKind::PackageExportAllDeclaration:
        case SyntaxKind::PackageExportDeclaration:
        case SyntaxKind::PackageImportDeclaration:
        case SyntaxKind::ParameterDeclarationStatement:
        case SyntaxKind::PathDeclaration:
        case SyntaxKind::PortDeclaration:
        case SyntaxKind::PrimitiveInstantiation:
        case SyntaxKind::ProgramDeclaration:
        case SyntaxKind::PropertyDeclaration:
        case SyntaxKind::PulseStyleDeclaration:
        case SyntaxKind::SequenceDeclaration:
        case SyntaxKind::SpecifyBlock:
        case SyntaxKind::SpecparamDeclaration:
        case SyntaxKind::SystemTimingCheck:
        case SyntaxKind::TaskDeclaration:
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::TypedefDeclaration:
        case SyntaxKind::UdpDeclaration:
        case SyntaxKind::UserDefinedNetDeclaration:
            return true;
        default:
            return false;
    }
}